

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void MapOptHandler_edata(FMapInfoParser *parse,level_info_t *info)

{
  FName local_24;
  FEDOptions *local_20;
  FEDOptions *opt;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  opt = (FEDOptions *)info;
  info_local = (level_info_t *)parse;
  FName::FName(&local_24,"EData");
  local_20 = level_info_t::GetOptData<FEDOptions>(info,&local_24,true);
  FMapInfoParser::ParseAssign((FMapInfoParser *)info_local);
  FScanner::MustGetString((FScanner *)info_local);
  FString::operator=(&local_20->EDName,*(char **)info_local);
  return;
}

Assistant:

DEFINE_MAP_OPTION(edata, false)
{
	FEDOptions *opt = info->GetOptData<FEDOptions>("EData");

	parse.ParseAssign();
	parse.sc.MustGetString();
	opt->EDName = parse.sc.String;
}